

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

QList<QByteArray> *
QTimeZonePrivate::windowsIdToIanaIds
          (QList<QByteArray> *__return_storage_ptr__,QByteArray *windowsId,Territory territory)

{
  long lVar1;
  quint16 qVar2;
  undefined2 *puVar3;
  ushort *puVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  iterator __begin4;
  QByteArray local_a0;
  undefined1 local_88 [32];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QStringTokenizerBase<QLatin1String,_QChar> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QByteArray *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if ((int)CONCAT62(in_register_00000012,territory) == 0x102) {
    windowsIdToDefaultIanaId((QByteArray *)local_88,windowsId);
    QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
              ((QMovableArrayOps<QByteArray> *)__return_storage_ptr__,
               (__return_storage_ptr__->d).size,(QByteArray *)local_88);
    QList<QByteArray>::end(__return_storage_ptr__);
    if ((QStringTokenizerBase<QLatin1String,_QChar> *)local_88._0_8_ !=
        (QStringTokenizerBase<QLatin1String,_QChar> *)0x0) {
      LOCK();
      ((__atomic_base<int> *)
      &(((QStringTokenizerBaseBase *)local_88._0_8_)->m_sb).
       super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i =
           ((__atomic_base<int> *)
           &(((QStringTokenizerBaseBase *)local_88._0_8_)->m_sb).
            super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)
          &(((QStringTokenizerBaseBase *)local_88._0_8_)->m_sb).
           super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)->_M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88._0_8_,1,0x10);
      }
    }
  }
  else {
    qVar2 = toWindowsIdKey(windowsId);
    puVar3 = &QtTimeZoneCldr::zoneDataTable;
    uVar7 = 0x169;
    do {
      uVar5 = uVar7 >> 1;
      uVar6 = uVar5;
      if ((int)(uint)(ushort)puVar3[uVar5 * 3] < (int)(short)qVar2) {
        uVar6 = ~uVar5 + uVar7;
        puVar3 = puVar3 + uVar5 * 3 + 3;
      }
      uVar7 = uVar6;
    } while (0 < (long)uVar6);
    if (puVar3 != (undefined2 *)&DAT_00596ae6) {
      puVar4 = puVar3 + 2;
      do {
        if (puVar4[-2] != qVar2) break;
        if ((uint)puVar4[-1] == (int)(short)territory) {
          local_48.m_haystack.m_data = "Asia/Kabul" + *puVar4;
          local_48.m_haystack.m_size = -1;
          do {
            lVar1 = local_48.m_haystack.m_size + (ulong)*puVar4 + 1;
            local_48.m_haystack.m_size = local_48.m_haystack.m_size + 1;
          } while ("Asia/Kabul"[lVar1] != '\0');
          local_48.super_QStringTokenizerBaseBase.m_sb.
          super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
          super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
               (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
          local_48.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
          local_48.m_needle.ucs = L' ';
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator
                    ((iterator *)local_88,&local_48);
          if (local_88[0x18] == true) {
            do {
              QByteArray::QByteArray(&local_a0,(char *)local_88._16_8_,local_88._8_8_);
              QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                        ((QMovableArrayOps<QByteArray> *)__return_storage_ptr__,
                         (__return_storage_ptr__->d).size,&local_a0);
              QList<QByteArray>::end(__return_storage_ptr__);
              if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,1,0x10);
                }
              }
              QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance((iterator *)local_88);
            } while (local_88[0x18] != false);
          }
          break;
        }
        bVar8 = puVar4 != (ushort *)&UNK_00596ae4;
        puVar4 = puVar4 + 3;
      } while (bVar8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QByteArray> QTimeZonePrivate::windowsIdToIanaIds(const QByteArray &windowsId,
                                                       QLocale::Territory territory)
{
    QList<QByteArray> list;
    if (territory == QLocale::World) {
        // World data are in windowsDataTable, not zoneDataTable.
        list << windowsIdToDefaultIanaId(windowsId);
    } else {
        const quint16 windowsIdKey = toWindowsIdKey(windowsId);
        const qint16 land = static_cast<quint16>(territory);
        for (auto data = zoneStartForWindowsId(windowsIdKey);
             data != std::end(zoneDataTable) && data->windowsIdKey == windowsIdKey;
             ++data) {
            // Return the region matches in preference order
            if (data->territory == land) {
                for (auto l1 : data->ids())
                    list << QByteArray(l1.data(), l1.size());
                break;
            }
        }
    }

    return list;
}